

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::BasicAllFormatsLoadStoreComputeStage::Run
          (BasicAllFormatsLoadStoreComputeStage *this)

{
  bool bVar1;
  long lVar2;
  Vector<float,_4> local_38;
  undefined1 local_28 [8];
  undefined8 uStack_20;
  
  local_28._0_4_ = 1.0;
  local_28._4_4_ = 2.0;
  uStack_20._0_4_ = 3.0;
  uStack_20._4_4_ = 4.0;
  local_38.m_data[0] = 2.0;
  local_38.m_data[1] = 4.0;
  local_38.m_data[2] = 6.0;
  local_38.m_data[3] = 8.0;
  bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
          Read<tcu::Vector<float,4>>
                    ((BasicAllFormatsLoadStoreComputeStage *)this,0x8814,
                     (Vector<float,_4> *)local_28,&local_38,0x1908,0x1406);
  lVar2 = -1;
  if (bVar1) {
    local_28._0_4_ = 1.0;
    local_28._4_4_ = 2.0;
    uStack_20._0_4_ = 3.0;
    uStack_20._4_4_ = 4.0;
    local_38.m_data[0] = 2.0;
    local_38.m_data[1] = 0.0;
    local_38.m_data[2] = 0.0;
    local_38.m_data[3] = 1.0;
    bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
            Read<tcu::Vector<float,4>>
                      ((BasicAllFormatsLoadStoreComputeStage *)this,0x822e,
                       (Vector<float,_4> *)local_28,&local_38,0x1903,0x1406);
    if (bVar1) {
      local_28._0_4_ = 1.0;
      local_28._4_4_ = 2.0;
      uStack_20._0_4_ = 3.0;
      uStack_20._4_4_ = 4.0;
      local_38.m_data[0] = 2.0;
      local_38.m_data[1] = 4.0;
      local_38.m_data[2] = 6.0;
      local_38.m_data[3] = 8.0;
      bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
              Read<tcu::Vector<float,4>>
                        ((BasicAllFormatsLoadStoreComputeStage *)this,0x881a,
                         (Vector<float,_4> *)local_28,&local_38,0x1908,0x1406);
      if (bVar1) {
        local_28._0_4_ = 1.4013e-45;
        local_28._4_4_ = -NAN;
        uStack_20._0_4_ = 4.2039e-45;
        uStack_20._4_4_ = -NAN;
        local_38.m_data[0] = 2.8026e-45;
        local_38.m_data[1] = -NAN;
        local_38.m_data[2] = 8.40779e-45;
        local_38.m_data[3] = -NAN;
        bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                Read<tcu::Vector<int,4>>
                          ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d82,
                           (Vector<int,_4> *)local_28,(Vector<int,_4> *)&local_38,0x8d99,0x1404);
        if (bVar1) {
          local_28._0_4_ = 1.4013e-45;
          local_28._4_4_ = -NAN;
          uStack_20._0_4_ = 4.2039e-45;
          uStack_20._4_4_ = -NAN;
          local_38.m_data[0] = 2.8026e-45;
          local_38.m_data[1] = 0.0;
          local_38.m_data[2] = 0.0;
          local_38.m_data[3] = 1.4013e-45;
          bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                  Read<tcu::Vector<int,4>>
                            ((BasicAllFormatsLoadStoreComputeStage *)this,0x8235,
                             (Vector<int,_4> *)local_28,(Vector<int,_4> *)&local_38,0x8d94,0x1404);
          if (bVar1) {
            local_28._0_4_ = 1.4013e-45;
            local_28._4_4_ = -NAN;
            uStack_20._0_4_ = 4.2039e-45;
            uStack_20._4_4_ = -NAN;
            local_38.m_data[0] = 2.8026e-45;
            local_38.m_data[1] = -NAN;
            local_38.m_data[2] = 8.40779e-45;
            local_38.m_data[3] = -NAN;
            bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                    Read<tcu::Vector<int,4>>
                              ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d88,
                               (Vector<int,_4> *)local_28,(Vector<int,_4> *)&local_38,0x8d99,0x1402)
            ;
            if (bVar1) {
              local_28._0_4_ = 1.4013e-45;
              local_28._4_4_ = -NAN;
              uStack_20._0_4_ = 4.2039e-45;
              uStack_20._4_4_ = -NAN;
              local_38.m_data[0] = 2.8026e-45;
              local_38.m_data[1] = -NAN;
              local_38.m_data[2] = 8.40779e-45;
              local_38.m_data[3] = -NAN;
              bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                      Read<tcu::Vector<int,4>>
                                ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d8e,
                                 (Vector<int,_4> *)local_28,(Vector<int,_4> *)&local_38,0x8d99,
                                 0x1400);
              if (bVar1) {
                local_28._0_4_ = 0.0;
                local_28._4_4_ = 1.4013e-45;
                uStack_20._0_4_ = 2.8026e-45;
                uStack_20._4_4_ = 4.2039e-45;
                local_38.m_data[0] = 0.0;
                local_38.m_data[1] = 2.8026e-45;
                local_38.m_data[2] = 5.60519e-45;
                local_38.m_data[3] = 8.40779e-45;
                bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                        Read<tcu::Vector<unsigned_int,4>>
                                  ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d70,
                                   (Vector<unsigned_int,_4> *)local_28,
                                   (Vector<unsigned_int,_4> *)&local_38,0x8d99,0x1405);
                if (bVar1) {
                  local_28._0_4_ = 9.80909e-45;
                  local_28._4_4_ = 2.8026e-45;
                  uStack_20._0_4_ = 4.2039e-45;
                  uStack_20._4_4_ = 5.60519e-45;
                  local_38.m_data[0] = 1.96182e-44;
                  local_38.m_data[1] = 0.0;
                  local_38.m_data[2] = 0.0;
                  local_38.m_data[3] = 1.4013e-45;
                  bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                          Read<tcu::Vector<unsigned_int,4>>
                                    ((BasicAllFormatsLoadStoreComputeStage *)this,0x8236,
                                     (Vector<unsigned_int,_4> *)local_28,
                                     (Vector<unsigned_int,_4> *)&local_38,0x8d94,0x1405);
                  if (bVar1) {
                    local_28._0_4_ = 0.0;
                    local_28._4_4_ = 1.4013e-45;
                    uStack_20._0_4_ = 2.8026e-45;
                    uStack_20._4_4_ = 4.2039e-45;
                    local_38.m_data[0] = 0.0;
                    local_38.m_data[1] = 2.8026e-45;
                    local_38.m_data[2] = 5.60519e-45;
                    local_38.m_data[3] = 8.40779e-45;
                    bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                            Read<tcu::Vector<unsigned_int,4>>
                                      ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d76,
                                       (Vector<unsigned_int,_4> *)local_28,
                                       (Vector<unsigned_int,_4> *)&local_38,0x8d99,0x1403);
                    if (bVar1) {
                      local_28._0_4_ = 0.0;
                      local_28._4_4_ = 1.4013e-45;
                      uStack_20._0_4_ = 2.8026e-45;
                      uStack_20._4_4_ = 4.2039e-45;
                      local_38.m_data[0] = 0.0;
                      local_38.m_data[1] = 2.8026e-45;
                      local_38.m_data[2] = 5.60519e-45;
                      local_38.m_data[3] = 8.40779e-45;
                      bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                              Read<tcu::Vector<unsigned_int,4>>
                                        ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d7c,
                                         (Vector<unsigned_int,_4> *)local_28,
                                         (Vector<unsigned_int,_4> *)&local_38,0x8d99,0x1401);
                      if (bVar1) {
                        local_28 = (undefined1  [8])&DAT_3f0000003f000000;
                        uStack_20 = &DAT_3f0000003f000000;
                        local_38.m_data[0] = 1.0;
                        local_38.m_data[1] = 1.0;
                        local_38.m_data[2] = 1.0;
                        local_38.m_data[3] = 1.0;
                        bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                                Read<tcu::Vector<float,4>>
                                          ((BasicAllFormatsLoadStoreComputeStage *)this,0x8058,
                                           (Vector<float,_4> *)local_28,&local_38,0x1908,0x1401);
                        if (bVar1) {
                          local_28._0_4_ = 0.5;
                          local_28._4_4_ = 0.0;
                          uStack_20._0_4_ = 0.5;
                          uStack_20._4_4_ = -0.5;
                          local_38.m_data[0] = 1.0;
                          local_38.m_data[1] = 0.0;
                          local_38.m_data[2] = 1.0;
                          local_38.m_data[3] = -1.0;
                          bVar1 = glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage
                                  ::Read<tcu::Vector<float,4>>
                                            ((BasicAllFormatsLoadStoreComputeStage *)this,0x8f97,
                                             (Vector<float,_4> *)local_28,&local_38,0x1908,0x1400);
                          lVar2 = (ulong)bVar1 - 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{

		if (!Read(GL_RGBA32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(2.0f, 4.0f, 6.0f, 8.0f), GL_RGBA, GL_FLOAT))
			return ERROR;
		if (!Read(GL_R32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(2.0f, 0.0f, 0.0f, 1.0f), GL_RED, GL_FLOAT))
			return ERROR;
		if (!Read(GL_RGBA16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(2.0f, 4.0f, 6.0f, 8.0f), GL_RGBA, GL_FLOAT))
			return ERROR;

		if (!Read(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(2, -4, 6, -8), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(GL_R32I, ivec4(1, -2, 3, -4), ivec4(2, 0, 0, 1), GL_RED_INTEGER, GL_INT))
			return ERROR;
		if (!Read(GL_RGBA16I, ivec4(1, -2, 3, -4), ivec4(2, -4, 6, -8), GL_RGBA_INTEGER, GL_SHORT))
			return ERROR;
		if (!Read(GL_RGBA8I, ivec4(1, -2, 3, -4), ivec4(2, -4, 6, -8), GL_RGBA_INTEGER, GL_BYTE))
			return ERROR;

		if (!Read(GL_RGBA32UI, uvec4(0, 1, 2, 3), uvec4(0, 2, 4, 6), GL_RGBA_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(GL_R32UI, uvec4(7, 2, 3, 4), uvec4(14, 0, 0, 1), GL_RED_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(GL_RGBA16UI, uvec4(0, 1, 2, 3), uvec4(0, 2, 4, 6), GL_RGBA_INTEGER, GL_UNSIGNED_SHORT))
			return ERROR;
		if (!Read(GL_RGBA8UI, uvec4(0, 1, 2, 3), uvec4(0, 2, 4, 6), GL_RGBA_INTEGER, GL_UNSIGNED_BYTE))
			return ERROR;

		if (!Read(GL_RGBA8, vec4(0.5f), vec4(1.0f), GL_RGBA, GL_UNSIGNED_BYTE))
			return ERROR;
		if (!Read(GL_RGBA8_SNORM, vec4(0.5f, 0.0f, 0.5f, -0.5f), vec4(1.0f, 0.0f, 1.0f, -1.0f), GL_RGBA, GL_BYTE))
			return ERROR;

		return NO_ERROR;
	}